

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbox.cpp
# Opt level: O1

void rw::xbox::uninstance(ObjPipeline *rwpipe,Atomic *atomic)

{
  byte *pbVar1;
  ushort uVar2;
  int iVar3;
  Geometry *this;
  InstanceDataHeader *pIVar4;
  long lVar5;
  uint32 uVar6;
  int *piVar7;
  int32 extraout_EDX;
  uint uVar8;
  int32 iVar9;
  long lVar10;
  undefined8 *puVar11;
  MeshHeader *pMVar12;
  
  this = atomic->geometry;
  if ((this->flags & 0x1000000) == 0) {
    return;
  }
  pMVar12 = this->meshHeader;
  pIVar4 = this->instData;
  lVar5 = *(long *)(pIVar4 + 10);
  pMVar12->totalIndices = 0;
  uVar2 = *(ushort *)((long)&pIVar4[2].platform + 2);
  if (uVar2 != 0) {
    uVar6 = pMVar12->totalIndices;
    piVar7 = (int *)(lVar5 + 8);
    lVar10 = 0;
    do {
      iVar3 = *piVar7;
      *(int *)((long)&pMVar12[1].totalIndices + lVar10) = iVar3;
      uVar6 = uVar6 + iVar3;
      piVar7 = piVar7 + 10;
      lVar10 = lVar10 + 0x18;
    } while ((ulong)uVar2 * 0x18 != lVar10);
    pMVar12->totalIndices = uVar6;
  }
  pMVar12->flags = (uint)(pIVar4[3].platform == 6);
  uVar6 = MeshHeader::guessNumTriangles(pMVar12);
  this->numTriangles = uVar6;
  Geometry::allocateData(this);
  uVar8 = 0;
  Geometry::allocateMeshes(this,(uint)this->meshHeader->numMeshes,this->meshHeader->totalIndices,0);
  if (*(short *)((long)&pIVar4[2].platform + 2) != 0) {
    pMVar12 = this->meshHeader + 1;
    puVar11 = (undefined8 *)(lVar5 + 0x10);
    do {
      memcpy(*(void **)pMVar12,(void *)*puVar11,(long)*(int *)(puVar11 + -1) * 2);
      pMVar12 = (MeshHeader *)&pMVar12[1].totalIndices;
      uVar8 = uVar8 + 1;
      puVar11 = puVar11 + 5;
    } while (uVar8 < *(ushort *)((long)&pIVar4[2].platform + 2));
  }
  (**(code **)&rwpipe[1].super_Pipeline.platform)(this);
  iVar9 = 0;
  Geometry::generateTriangles(this,(int8 *)0x0);
  pbVar1 = (byte *)((long)&this->flags + 3);
  *pbVar1 = *pbVar1 & 0xfe;
  destroyNativeData(this,iVar9,extraout_EDX);
  return;
}

Assistant:

static void
uninstance(rw::ObjPipeline *rwpipe, Atomic *atomic)
{
	ObjPipeline *pipe = (ObjPipeline*)rwpipe;
	Geometry *geo = atomic->geometry;
	if((geo->flags & Geometry::NATIVE) == 0)
		return;
	assert(geo->instData != nil);
	assert(geo->instData->platform == PLATFORM_XBOX);

	InstanceDataHeader *header = (InstanceDataHeader*)geo->instData;
	InstanceData *inst = header->begin;
	Mesh *mesh = geo->meshHeader->getMeshes();
	// For some reason numIndices in mesh and instance data are not always equal
	// And primitive isn't always correct either. Maybe some internal conversion...
	geo->meshHeader->totalIndices = 0;
	for(uint32 i = 0; i < header->numMeshes; i++){
		mesh[i].numIndices = inst[i].numIndices;
		geo->meshHeader->totalIndices += mesh[i].numIndices;
	}
	geo->meshHeader->flags = header->primType == D3DPT_TRIANGLESTRIP ?
		MeshHeader::TRISTRIP : 0;

	geo->numTriangles = geo->meshHeader->guessNumTriangles();
	geo->allocateData();
	geo->allocateMeshes(geo->meshHeader->numMeshes, geo->meshHeader->totalIndices, 0);

	mesh = geo->meshHeader->getMeshes();
	for(uint32 i = 0; i < header->numMeshes; i++){
		uint16 *indices = (uint16*)inst->indexBuffer;
		memcpy(mesh->indices, indices, inst->numIndices*2);
		mesh++;
		inst++;
	}

	pipe->uninstanceCB(geo, header);
	geo->generateTriangles();
	geo->flags &= ~Geometry::NATIVE;
	destroyNativeData(geo, 0, 0);
}